

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ColladaParser.cpp
# Opt level: O3

char * __thiscall Assimp::ColladaParser::TestTextContent(ColladaParser *this)

{
  int iVar1;
  undefined4 extraout_var;
  byte *pbVar2;
  
  iVar1 = (*this->mReader->_vptr_IIrrXMLReader[3])();
  if ((((iVar1 == 1) && (iVar1 = (*this->mReader->_vptr_IIrrXMLReader[0xf])(), (char)iVar1 == '\0'))
      && (iVar1 = (*this->mReader->_vptr_IIrrXMLReader[2])(), (char)iVar1 != '\0')) &&
     ((iVar1 = (*this->mReader->_vptr_IIrrXMLReader[3])(), iVar1 == 3 ||
      (iVar1 = (*this->mReader->_vptr_IIrrXMLReader[3])(), iVar1 == 5)))) {
    iVar1 = (*this->mReader->_vptr_IIrrXMLReader[0xe])();
    pbVar2 = (byte *)CONCAT44(extraout_var,iVar1);
    while( true ) {
      if (0x20 < (ulong)*pbVar2) {
        return (char *)pbVar2;
      }
      if ((0x100002600U >> ((ulong)*pbVar2 & 0x3f) & 1) == 0) break;
      pbVar2 = pbVar2 + 1;
    }
    return (char *)pbVar2;
  }
  return (char *)0x0;
}

Assistant:

const char* ColladaParser::TestTextContent()
{
    // present node should be the beginning of an element
    if (mReader->getNodeType() != irr::io::EXN_ELEMENT || mReader->isEmptyElement())
        return NULL;

    // read contents of the element
    if (!mReader->read())
        return NULL;
    if (mReader->getNodeType() != irr::io::EXN_TEXT && mReader->getNodeType() != irr::io::EXN_CDATA)
        return NULL;

    // skip leading whitespace
    const char* text = mReader->getNodeData();
    SkipSpacesAndLineEnd(&text);

    return text;
}